

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::php::anon_unknown_0::PhpGeneratorTest_RequiredFieldError_Test::TestBody
          (PhpGeneratorTest_RequiredFieldError_Test *this)

{
  string_view name;
  string_view command;
  string_view expected_substring;
  string_view contents;
  
  name._M_str = "foo.proto";
  name._M_len = 9;
  contents._M_str =
       "\n    syntax = \"proto2\";\n    message FooBar {\n      required int32 foo_message = 1;\n    }"
  ;
  contents._M_len = 0x58;
  CommandLineInterfaceTester::CreateTempFile((CommandLineInterfaceTester *)this,name,contents);
  command._M_str = "protocol_compiler --proto_path=$tmpdir --php_out=$tmpdir foo.proto";
  command._M_len = 0x42;
  CommandLineInterfaceTester::RunProtoc((CommandLineInterfaceTester *)this,command);
  expected_substring._M_str = "Can\'t generate PHP code for required field FooBar.foo_message";
  expected_substring._M_len = 0x3d;
  CommandLineInterfaceTester::ExpectErrorSubstring
            ((CommandLineInterfaceTester *)this,expected_substring);
  return;
}

Assistant:

TEST_F(PhpGeneratorTest, RequiredFieldError) {
  CreateTempFile("foo.proto",
                 R"schema(
    syntax = "proto2";
    message FooBar {
      required int32 foo_message = 1;
    })schema");

  RunProtoc(
      "protocol_compiler --proto_path=$tmpdir --php_out=$tmpdir foo.proto");

  ExpectErrorSubstring(
      "Can't generate PHP code for required field FooBar.foo_message");
}